

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O1

void pcp_db_add_md(pcp_flow_t *f,uint16_t md_id,void *val,size_t val_len)

{
  uint32_t uVar1;
  uint uVar2;
  md_val_t *__ptr;
  md_val_t *pmVar3;
  md_val_t *pmVar4;
  size_t __n;
  uint32_t uVar5;
  
  if (f == (pcp_flow_t *)0x0) {
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                  ,0xed,"void pcp_db_add_md(pcp_flow_t *, uint16_t, void *, size_t)");
  }
  uVar1 = f->md_val_count;
  __ptr = f->md_vals;
  pmVar4 = __ptr;
  uVar5 = uVar1;
  if (__ptr != (md_val_t *)0x0 && uVar1 != 0) {
    do {
      if (pmVar4->md_id == md_id) goto LAB_00103cdb;
      pmVar4 = pmVar4 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    uVar5 = 0;
  }
LAB_00103cdb:
  pmVar3 = (md_val_t *)0x0;
  if (uVar5 != 0) {
    pmVar3 = pmVar4;
  }
  if (pmVar3 == (md_val_t *)0x0) {
    pmVar3 = (md_val_t *)realloc(__ptr,(ulong)(uVar1 + 1) * 0x1c);
    if (pmVar3 == (md_val_t *)0x0) {
      return;
    }
    f->md_vals = pmVar3;
    uVar2 = f->md_val_count;
    f->md_val_count = uVar2 + 1;
    pmVar3 = pmVar3 + uVar2;
  }
  pmVar3->md_id = md_id;
  if (val == (void *)0x0 || val_len == 0) {
    pmVar3->val_len = 0;
    return;
  }
  __n = 0x18;
  if (val_len < 0x18) {
    __n = val_len;
  }
  pmVar3->val_len = (uint16_t)__n;
  memcpy(pmVar3->val_buf,val,__n);
  return;
}

Assistant:

void pcp_db_add_md(pcp_flow_t *f, uint16_t md_id, void *val, size_t val_len) {
    md_val_t *md;
    uint32_t i;

    assert(f);

    for (i = f->md_val_count, md = f->md_vals; i > 0 && md != NULL; --i, ++md) {
        if (md->md_id == md_id) {
            break;
        }
    }
    if (i == 0) {
        md = NULL;
    }

    if (!md) {
        md = (md_val_t *)realloc(f->md_vals,
                                 sizeof(f->md_vals[0]) * (f->md_val_count + 1));
        if (!md) { // LCOV_EXCL_START
            return;
        } // LCOV_EXCL_STOP
        f->md_vals = md;
        md = f->md_vals + f->md_val_count++;
    }
    md->md_id = md_id;
    if ((val_len > 0) && (val != NULL)) {
        md->val_len =
            val_len > sizeof(md->val_buf) ? sizeof(md->val_buf) : val_len;
        memcpy(md->val_buf, val, md->val_len);
    } else {
        md->val_len = 0;
    }
}